

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StripWhitespace(string *str)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  pointer pcVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = str->_M_string_length;
  uVar6 = (uint)uVar7;
  if ((int)uVar6 < 1) {
    if (uVar6 != 0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) goto LAB_001d96e0;
      bVar1 = (str->_M_dataplus)._M_p[uVar8];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if (uVar6 != (uint)uVar8) {
          if (uVar8 != 0) {
            std::__cxx11::string::erase((ulong)str,0);
            uVar7 = (ulong)(uVar6 - (uint)uVar8);
          }
          if ((int)uVar7 < 1) {
            return;
          }
          lVar3 = -(uVar7 & 0xffffffff);
          iVar4 = 0;
          goto LAB_001d9682;
        }
        break;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  str->_M_string_length = 0;
  pcVar5 = (str->_M_dataplus)._M_p;
LAB_001d96ca:
  *pcVar5 = '\0';
  return;
LAB_001d9682:
  iVar2 = (int)uVar7;
  if (str->_M_string_length <= (ulong)(iVar2 - 1)) {
LAB_001d96e0:
    do {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    } while( true );
  }
  pcVar5 = (str->_M_dataplus)._M_p;
  bVar1 = pcVar5[iVar2 - 1];
  if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
    if (iVar4 == 0) {
      return;
    }
    pcVar5 = pcVar5 + -lVar3;
    str->_M_string_length = -lVar3;
    goto LAB_001d96ca;
  }
  lVar3 = lVar3 + 1;
  iVar4 = iVar4 + 1;
  uVar7 = (ulong)(iVar2 - 1U);
  if (iVar2 - 1U == 0 || iVar2 < 1) {
    return;
  }
  goto LAB_001d9682;
}

Assistant:

void StripWhitespace(std::string *str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}